

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::Shape::readFrom(Shape *this,BinaryReader *binary)

{
  char cVar1;
  BinaryReader *in_RSI;
  float *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  *in_stack_00000048;
  BinaryReader *in_stack_00000050;
  
  BinaryReader::read<pbrt::Material>((BinaryReader *)this,(shared_ptr<pbrt::Material> *)binary);
  BinaryReader::read<std::__cxx11::string,std::shared_ptr<pbrt::Texture>>
            (in_stack_00000050,in_stack_00000048);
  BinaryReader::read<pbrt::AreaLight>((BinaryReader *)this,(shared_ptr<pbrt::AreaLight> *)binary);
  cVar1 = BinaryReader::read<signed_char>(in_RSI);
  *(bool *)(in_RDI + 10) = cVar1 != '\0';
  BinaryReader::read<float,void>(in_RSI,in_RDI);
  return;
}

Assistant:

void Shape::readFrom(BinaryReader &binary) 
  {
    binary.read(material);
    binary.read(textures);
    binary.read(areaLight);
    reverseOrientation = binary.read<int8_t>();
    binary.read(alpha);
  }